

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsCliqueTable.cpp
# Opt level: O0

HighsInt __thiscall
HighsCliqueTable::shrinkToNeighbourhood
          (HighsCliqueTable *this,vector<int,_std::allocator<int>_> *neighbourhoodInds,
          int64_t *numQueries,CliqueVar v,CliqueVar *q,HighsInt N)

{
  size_type sVar1;
  reference pvVar2;
  vector<int,_std::allocator<int>_> *in_RSI;
  long in_R8;
  HighsInt i;
  HighsInt in_stack_0000004c;
  CliqueVar *in_stack_00000050;
  int64_t *in_stack_00000058;
  vector<int,_std::allocator<int>_> *in_stack_00000060;
  HighsCliqueTable *in_stack_00000068;
  CliqueVar in_stack_00000074;
  undefined4 local_34;
  
  queryNeighbourhood(in_stack_00000068,in_stack_00000060,in_stack_00000058,in_stack_00000074,
                     in_stack_00000050,in_stack_0000004c);
  local_34 = 0;
  while( true ) {
    sVar1 = std::vector<int,_std::allocator<int>_>::size(in_RSI);
    if ((int)sVar1 <= local_34) break;
    pvVar2 = std::vector<int,_std::allocator<int>_>::operator[](in_RSI,(long)local_34);
    *(undefined4 *)(in_R8 + (long)local_34 * 4) = *(undefined4 *)(in_R8 + (long)*pvVar2 * 4);
    local_34 = local_34 + 1;
  }
  sVar1 = std::vector<int,_std::allocator<int>_>::size(in_RSI);
  return (HighsInt)sVar1;
}

Assistant:

HighsInt HighsCliqueTable::shrinkToNeighbourhood(
    std::vector<HighsInt>& neighbourhoodInds, int64_t& numQueries, CliqueVar v,
    CliqueVar* q, HighsInt N) {
  queryNeighbourhood(neighbourhoodInds, numQueries, v, q, N);

  for (HighsInt i = 0; i < (HighsInt)neighbourhoodInds.size(); ++i)
    q[i] = q[neighbourhoodInds[i]];

  return neighbourhoodInds.size();
}